

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::SetNextItemOpen(bool is_open,ImGuiCond cond)

{
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  if (GImGui->CurrentWindow->SkipItems == false) {
    *(byte *)&(GImGui->NextItemData).Flags = (byte)(GImGui->NextItemData).Flags | 2;
    (pIVar1->NextItemData).OpenVal = is_open;
    (pIVar1->NextItemData).OpenCond = cond + (uint)(cond == 0);
  }
  return;
}

Assistant:

void ImGui::SetNextItemOpen(bool is_open, ImGuiCond cond)
{
    ImGuiContext& g = *GImGui;
    if (g.CurrentWindow->SkipItems)
        return;
    g.NextItemData.Flags |= ImGuiNextItemDataFlags_HasOpen;
    g.NextItemData.OpenVal = is_open;
    g.NextItemData.OpenCond = cond ? cond : ImGuiCond_Always;
}